

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::construct
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 *intervals_,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *filter,bool erase_below_diagonal,size_t number_of_pixels,double min_,double max_)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pointer pvVar6;
  int iVar7;
  int iVar8;
  pointer pvVar9;
  const_reference pvVar10;
  size_type sVar11;
  reference pvVar12;
  reference pvVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  size_type local_e0;
  size_t j_1;
  size_t i_3;
  size_t j;
  size_t i_2;
  double scaling_value;
  int y_grid;
  int x_grid;
  size_t pt_nr;
  allocator<double> local_91;
  value_type_conflict1 local_90;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> v;
  size_t i_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_map_;
  size_t i;
  constant_scaling_function f;
  double dStack_40;
  bool dbg;
  double max__local;
  double min__local;
  size_t number_of_pixels_local;
  bool erase_below_diagonal_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *filter_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *intervals__local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  undefined4 uVar17;
  
  dStack_40 = max_;
  max__local = min_;
  if ((min_ == max_) && (!NAN(min_) && !NAN(max_))) {
    iVar7 = std::numeric_limits<int>::max();
    max__local = (double)iVar7;
    iVar7 = std::numeric_limits<int>::max();
    dStack_40 = (double)-iVar7;
    for (heat_map_.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pvVar6 = heat_map_.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        pvVar9 = (pointer)std::
                          vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ::size(intervals_), pvVar6 != pvVar9;
        heat_map_.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&((heat_map_.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start + 1)) {
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](intervals_,
                             (size_type)
                             heat_map_.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (pvVar10->first < max__local) {
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](intervals_,
                             (size_type)
                             heat_map_.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        max__local = pvVar10->first;
      }
      pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ::operator[](intervals_,
                             (size_type)
                             heat_map_.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (dStack_40 < pvVar10->second) {
        pvVar10 = std::
                  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                  operator[](intervals_,
                             (size_type)
                             heat_map_.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        dStack_40 = pvVar10->second;
      }
    }
    max__local = max__local - ABS(dStack_40 - max__local) / 100.0;
    dStack_40 = ABS(dStack_40 - max__local) / 100.0 + dStack_40;
  }
  this->min_ = max__local;
  this->max_ = dStack_40;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&i_1);
  for (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)number_of_pixels;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    local_90 = 0.0;
    std::allocator<double>::allocator(&local_91);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_88,number_of_pixels,&local_90,
               &local_91);
    std::allocator<double>::~allocator(&local_91);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&i_1,(value_type *)local_88);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_88);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&i_1);
  for (_y_grid = 0;
      sVar11 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               size(intervals_), _y_grid != sVar11; _y_grid = _y_grid + 1) {
    pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              operator[](intervals_,_y_grid);
    dVar14 = pvVar10->first;
    dVar1 = this->min_;
    dVar2 = this->max_;
    uVar17 = (undefined4)(number_of_pixels >> 0x20);
    auVar15._8_4_ = uVar17;
    auVar15._0_8_ = number_of_pixels;
    auVar15._12_4_ = 0x45300000;
    pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              operator[](intervals_,_y_grid);
    dVar3 = pvVar10->second;
    dVar4 = this->min_;
    dVar5 = this->max_;
    auVar16._8_4_ = uVar17;
    auVar16._0_8_ = number_of_pixels;
    auVar16._12_4_ = 0x45300000;
    sVar11 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::size(filter);
    iVar7 = (int)(((dVar14 - dVar1) / (dVar2 - dVar1)) *
                 ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)number_of_pixels) - 4503599627370496.0))) -
            (int)(sVar11 >> 1);
    sVar11 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::size(filter);
    iVar8 = (int)(((dVar3 - dVar4) / (dVar5 - dVar4)) *
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)number_of_pixels) - 4503599627370496.0))) -
            (int)(sVar11 >> 1);
    pvVar10 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              operator[](intervals_,_y_grid);
    dVar14 = constant_scaling_function::operator()
                       ((constant_scaling_function *)&this->field_0x68,pvVar10);
    for (j = 0; sVar11 = std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::size(filter), j != sVar11; j = j + 1) {
      for (i_3 = 0; sVar11 = std::
                             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ::size(filter), i_3 != sVar11; i_3 = i_3 + 1) {
        sVar11 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::size(&this->heat_map);
        if (((long)iVar7 + j < sVar11) &&
           (sVar11 = std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::size(&this->heat_map), (long)iVar8 + i_3 < sVar11)) {
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](filter,j);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar12,i_3);
          dVar1 = *pvVar13;
          pvVar12 = std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::operator[](&this->heat_map,(long)iVar8 + i_3);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              (pvVar12,(long)iVar7 + j);
          *pvVar13 = dVar14 * dVar1 + *pvVar13;
        }
      }
    }
  }
  if (erase_below_diagonal) {
    for (j_1 = 0; sVar11 = std::
                           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ::size(&this->heat_map), j_1 != sVar11; j_1 = j_1 + 1) {
      for (local_e0 = j_1;
          sVar11 = std::
                   vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ::size(&this->heat_map), local_e0 != sVar11; local_e0 = local_e0 + 1) {
        pvVar12 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&this->heat_map,j_1);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[](pvVar12,local_e0);
        *pvVar13 = 0.0;
      }
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&i_1);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::construct(const std::vector<std::pair<double, double> >& intervals_,
                                                           std::vector<std::vector<double> > filter,
                                                           bool erase_below_diagonal, size_t number_of_pixels,
                                                           double min_, double max_) {
  bool dbg = false;
  if (dbg) std::clog << "Entering construct procedure \n";
  Scalling_of_kernels f;
  this->f = f;

  if (dbg) std::clog << "min and max passed to construct() procedure: " << min_ << " " << max_ << std::endl;

  if (min_ == max_) {
    if (dbg) std::clog << "min and max parameters will be determined based on intervals \n";
    // in this case, we want the program to set up the min_ and max_ values by itself.
    min_ = std::numeric_limits<int>::max();
    max_ = -std::numeric_limits<int>::max();

    for (size_t i = 0; i != intervals_.size(); ++i) {
      if (intervals_[i].first < min_) min_ = intervals_[i].first;
      if (intervals_[i].second > max_) max_ = intervals_[i].second;
    }
    // now we have the structure filled in, and moreover we know min_ and max_ values of the interval, so we know the
    // range.

    // add some more space:
    min_ -= fabs(max_ - min_) / 100;
    max_ += fabs(max_ - min_) / 100;
  }

  if (dbg) {
    std::clog << "min_ : " << min_ << std::endl;
    std::clog << "max_ : " << max_ << std::endl;
    std::clog << "number_of_pixels : " << number_of_pixels << std::endl;
    getchar();
  }

  this->min_ = min_;
  this->max_ = max_;

  // initialization of the structure heat_map
  std::vector<std::vector<double> > heat_map_;
  for (size_t i = 0; i != number_of_pixels; ++i) {
    std::vector<double> v(number_of_pixels, 0);
    heat_map_.push_back(v);
  }
  this->heat_map = heat_map_;

  if (dbg) std::clog << "Done creating of the heat map, now we will fill in the structure \n";

  for (size_t pt_nr = 0; pt_nr != intervals_.size(); ++pt_nr) {
    // compute the value of intervals_[pt_nr] in the grid:
    int x_grid =
        static_cast<int>((intervals_[pt_nr].first - this->min_) / (this->max_ - this->min_) * number_of_pixels);
    int y_grid =
        static_cast<int>((intervals_[pt_nr].second - this->min_) / (this->max_ - this->min_) * number_of_pixels);

    if (dbg) {
      std::clog << "point : " << intervals_[pt_nr].first << " , " << intervals_[pt_nr].second << std::endl;
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    // x_grid and y_grid gives a center of the kernel. We want to have its lower left corner. To get this, we need to
    // shift x_grid and y_grid by a grid diameter.
    x_grid -= filter.size() / 2;
    y_grid -= filter.size() / 2;
    // note that the numbers x_grid and y_grid may be negative.

    if (dbg) {
      std::clog << "After shift : \n";
      std::clog << "x_grid : " << x_grid << std::endl;
      std::clog << "y_grid : " << y_grid << std::endl;
    }

    double scaling_value = this->f(intervals_[pt_nr]);

    for (size_t i = 0; i != filter.size(); ++i) {
      for (size_t j = 0; j != filter.size(); ++j) {
        // if the point (x_grid+i,y_grid+j) is the correct point in the grid.
        if (((x_grid + i) >= 0) && (x_grid + i < this->heat_map.size()) && ((y_grid + j) >= 0) &&
            (y_grid + j < this->heat_map.size())) {
          if (dbg) {
            std::clog << y_grid + j << " " << x_grid + i << std::endl;
          }
          this->heat_map[y_grid + j][x_grid + i] += scaling_value * filter[i][j];
          if (dbg) {
            std::clog << "Position : (" << x_grid + i << "," << y_grid + j
                      << ") got increased by the value : " << filter[i][j] << std::endl;
          }
        }
      }
    }
  }

  // now it remains to cut everything below diagonal if the user wants us to.
  if (erase_below_diagonal) {
    for (size_t i = 0; i != this->heat_map.size(); ++i) {
      for (size_t j = i; j != this->heat_map.size(); ++j) {
        this->heat_map[i][j] = 0;
      }
    }
  }
}